

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O1

int Ssc_GiaSimClassRefineOneBit(Gia_Man_t *p,int i)

{
  Vec_Int_t *p_00;
  ulong uVar1;
  ulong uVar2;
  uint Entry;
  bool bVar3;
  
  if (((~(uint)p->pReprs[i] & 0xfffffff) != 0) || (p->pNexts[i] < 1)) {
    __assert_fail("Gia_ObjIsHead( p, i )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscClass.c"
                  ,0xa6,"int Ssc_GiaSimClassRefineOneBit(Gia_Man_t *, int)");
  }
  p_00 = p->vClassOld;
  p_00->nSize = 0;
  p->vClassNew->nSize = 0;
  Vec_IntPush(p_00,i);
  if ((-1 < i) && (i < p->nObjs)) {
    if (((~(uint)p->pReprs[i] & 0xfffffff) != 0) || (p->pNexts[i] < 1)) {
      __assert_fail("Gia_ObjIsHead(p, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscClass.c"
                    ,0xab,"int Ssc_GiaSimClassRefineOneBit(Gia_Man_t *, int)");
    }
    Entry = p->pNexts[i];
    if (0 < (int)Entry) {
      do {
        if ((p->nObjs <= i) || (p->nObjs <= (int)Entry)) goto LAB_00908639;
        uVar1 = *(ulong *)(p->pObjs + (uint)i);
        uVar2 = *(ulong *)(p->pObjs + Entry);
        Vec_IntPush((&p->vClassOld)
                    [((uint)(uVar1 >> 0x1e) & 1 ^ (uint)(uVar1 >> 0x3f)) !=
                     ((uint)(uVar2 >> 0x1e) & 1 ^ (uint)(uVar2 >> 0x3f))],Entry);
        Entry = p->pNexts[Entry];
      } while (0 < (int)Entry);
    }
    bVar3 = p->vClassNew->nSize != 0;
    if (bVar3) {
      Ssc_GiaSimClassCreate(p,p->vClassOld);
      Ssc_GiaSimClassCreate(p,p->vClassNew);
    }
    return (uint)bVar3;
  }
LAB_00908639:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Ssc_GiaSimClassRefineOneBit( Gia_Man_t * p, int i )
{
    Gia_Obj_t * pObj;
    int Ent;
    assert( Gia_ObjIsHead( p, i ) );
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pObj = Gia_ManObj(p, i);
    Gia_ClassForEachObj1( p, i, Ent )
    {
        if ( Ssc_GiaSimAreEqualBit( p, i, Ent ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
            Vec_IntPush( p->vClassNew, Ent );
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Ssc_GiaSimClassCreate( p, p->vClassOld );
    Ssc_GiaSimClassCreate( p, p->vClassNew );
    return 1;
}